

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O0

CExtPubKey * DecodeExtPubKey(string *str)

{
  long lVar1;
  bool bVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first2;
  size_type sVar3;
  size_type sVar4;
  CExtPubKey *this;
  CExtPubKey *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *prefix;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  CExtPubKey *in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined8 in_stack_ffffffffffffff70;
  int max_ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first1;
  
  max_ret = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first1._M_current = in_RDI->version;
  CExtPubKey::CExtPubKey(in_stack_ffffffffffffff58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff58);
  bVar2 = DecodeBase58Check(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,max_ret);
  if (bVar2) {
    __last1._M_current = (uchar *)Params();
    __first2._M_current =
         (uchar *)CChainParams::Base58Prefix
                            ((CChainParams *)
                             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                             (Base58Type)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffff58);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffff58);
    if (sVar3 == sVar4 + 0x4a) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff60);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff60);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff6f =
           std::
           equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                     (__first1,__last1,__first2);
      if ((bool)in_stack_ffffffffffffff6f) {
        this = (CExtPubKey *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          in_stack_ffffffffffffff58);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff58);
        CExtPubKey::Decode(this,in_stack_ffffffffffffff58->version);
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CExtPubKey DecodeExtPubKey(const std::string& str)
{
    CExtPubKey key;
    std::vector<unsigned char> data;
    if (DecodeBase58Check(str, data, 78)) {
        const std::vector<unsigned char>& prefix = Params().Base58Prefix(CChainParams::EXT_PUBLIC_KEY);
        if (data.size() == BIP32_EXTKEY_SIZE + prefix.size() && std::equal(prefix.begin(), prefix.end(), data.begin())) {
            key.Decode(data.data() + prefix.size());
        }
    }
    return key;
}